

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list.h
# Opt level: O2

LinkedList<char> * __thiscall
data_structures::LinkedList<char>::operator=(LinkedList<char> *this,LinkedList<char> *list)

{
  ListNode<char> *pLVar1;
  
  pLVar1 = (ListNode<char> *)operator_new(0x18);
  pLVar1->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010bd88;
  pLVar1->_next = (ListNode<char> *)0x0;
  pLVar1->element = '\0';
  this->_header = pLVar1;
  this->_tail = pLVar1;
  this->_size = 0;
  pLVar1 = list->_header;
  while (list->_tail != pLVar1) {
    pLVar1 = pLVar1->_next;
    insertToTail(this,&pLVar1->element);
  }
  return this;
}

Assistant:

inline
    LinkedList<T>& LinkedList<T>::operator=(const LinkedList<T>& list) {
        _header = new ListNode<T>();
        _tail = _header;
        _size = 0;
        ListNode<T>* _current = list._header;
        while (!list.isTail(_current)) {
            _current = _current->next();
            insertToTail(_current->element);
        }
        return *this;
    }